

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tok_ifdef_ifndef(tokcxdef *ctx,char *p,int len,int is_ifdef)

{
  int iVar1;
  tokdfdef *ptVar2;
  int in_ECX;
  tokcxdef *in_RSI;
  tokcxdef *in_RDI;
  bool bVar3;
  char mysym [39];
  int found;
  int stat;
  char *sym;
  int symlen;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  errcxdef *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  tokcxdef *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  char cVar4;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = tok_scan_defsym((tokcxdef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (iVar1 != 0) {
    tok_casefold_defsym(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                        ,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    ptVar2 = tok_find_define(in_stack_ffffffffffffffc8,
                             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffbc);
    bVar3 = ptVar2 != (tokdfdef *)0x0;
    if (in_ECX == 0) {
      bVar3 = !bVar3;
    }
    if (bVar3) {
      cVar4 = '\x01';
    }
    else {
      cVar4 = '\x02';
    }
    in_RDI->tokcxif[in_RDI->tokcxifcnt] = cVar4;
    if (in_RDI->tokcxifcnt < 0x40) {
      in_RDI->tokcxifcnt = in_RDI->tokcxifcnt + 1;
      tok_update_if_stat(in_RDI);
    }
    else {
      errlogf(in_stack_ffffffffffffffb0,
              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
  }
  return;
}

Assistant:

static void tok_ifdef_ifndef(tokcxdef *ctx, char *p, int len, int is_ifdef)
{
    int   symlen;
    char *sym;
    int   stat;
    int   found;
    char  mysym[TOKNAMMAX];

    /* get the symbol */
    sym = p;
    if (!(symlen = tok_scan_defsym(ctx, p, len)))
        return;

    /* if we're folding case, convert the symbol to lower case */
    sym = tok_casefold_defsym(ctx, mysym, sym, symlen);

    /* see if we can find it in the table, and set the status accordingly */
    found = (tok_find_define(ctx, sym, symlen) != 0);

    /* invert the test if this is an ifndef */
    if (!is_ifdef) found = !found;

    /* set the #if status accordingly */
    if (found)
        stat = TOKIF_IF_YES;
    else
        stat = TOKIF_IF_NO;
    ctx->tokcxif[ctx->tokcxifcnt] = stat;

    /* allocate a new #if level (making sure we have room) */
    if (ctx->tokcxifcnt >= TOKIFNEST)
    {
        errlog(ctx->tokcxerr, ERR_MANYPIF);
        return;
    }
    ctx->tokcxifcnt++;

    /* update the current status */
    tok_update_if_stat(ctx);
}